

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.h
# Opt level: O1

ptrdiff_t __thiscall soplex::DataSet<int>::reMax(DataSet<int> *this,int newmax)

{
  Item *pIVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  
  pIVar1 = this->theitem;
  uVar4 = this->firstfree;
  if ((this->themax ^ uVar4) == 0xffffffff) {
    piVar2 = &this->firstfree;
  }
  else {
    do {
      uVar3 = ~uVar4;
      uVar4 = pIVar1[(int)uVar3].info;
    } while ((this->themax ^ uVar4) != 0xffffffff);
    piVar2 = &pIVar1[(int)uVar3].info;
  }
  if (newmax < this->thesize) {
    newmax = this->thesize;
  }
  *piVar2 = ~newmax;
  this->themax = newmax;
  spx_realloc<soplex::DataSet<int>::Item*>(&this->theitem,newmax);
  spx_realloc<soplex::DataKey*>(&this->thekey,this->themax);
  return (long)this->theitem - (long)pIVar1;
}

Assistant:

ptrdiff_t reMax(int newmax = 0)
   {
      struct Item* old_theitem = theitem;
      newmax = (newmax < size()) ? size() : newmax;

      int* lastfree = &firstfree;

      while(*lastfree != -themax - 1)
         lastfree = &(theitem[ -1 - *lastfree].info);

      *lastfree = -newmax - 1;

      themax = newmax;
      spx_realloc(theitem, themax);
      spx_realloc(thekey,  themax);

      return reinterpret_cast<char*>(theitem)
             - reinterpret_cast<char*>(old_theitem);
   }